

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O0

void __thiscall amrex::MLMG::~MLMG(MLMG *this)

{
  unique_ptr<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_> *in_RDI;
  unique_ptr<amrex::MLMG,_std::default_delete<amrex::MLMG>_> *unaff_retaddr;
  
  Vector<double,_std::allocator<double>_>::~Vector
            ((Vector<double,_std::allocator<double>_> *)0x14f2fbf);
  Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x14f2fd0);
  Vector<double,_std::allocator<double>_>::~Vector
            ((Vector<double,_std::allocator<double>_> *)0x14f2fe1);
  Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::~Vector((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
             *)0x14f2ff2);
  Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::~Vector((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
             *)0x14f3003);
  Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::~Vector((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
             *)0x14f3014);
  Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::~Vector((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
             *)0x14f3025);
  Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x14f3036);
  Vector<amrex::Any,_std::allocator<amrex::Any>_>::~Vector
            ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)0x14f3047);
  Vector<amrex::Any,_std::allocator<amrex::Any>_>::~Vector
            ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)0x14f3058);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)in_RDI);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)in_RDI);
  std::unique_ptr<amrex::MLMG,_std::default_delete<amrex::MLMG>_>::~unique_ptr(unaff_retaddr);
  std::unique_ptr<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>::~unique_ptr(in_RDI);
  return;
}

Assistant:

MLMG::~MLMG ()
{}